

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

HelicsCore helicsFederateGetCore(HelicsFederate fed,HelicsError *err)

{
  Federate *pFVar1;
  _Head_base<0UL,_helics::CoreObject_*,_false> _Var2;
  __single_object core;
  _Head_base<0UL,_helics::CoreObject_*,_false> local_30;
  __uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> local_28;
  MasterObjectHolder *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  pFVar1 = getFed(fed,err);
  if (pFVar1 == (Federate *)0x0) {
    _Var2._M_head_impl = (CoreObject *)0x0;
  }
  else {
    std::make_unique<helics::CoreObject>();
    (local_30._M_head_impl)->valid = 0x378424ec;
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)local_30._M_head_impl,
               &(pFVar1->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>);
    _Var2._M_head_impl = local_30._M_head_impl;
    getMasterHolder();
    local_28._M_t.
    super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
    super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl =
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         local_30._M_head_impl;
    local_30._M_head_impl = (CoreObject *)0x0;
    MasterObjectHolder::addCore
              (local_20,(unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                        &local_28);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_28
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_30
              );
  }
  return _Var2._M_head_impl;
}

Assistant:

HelicsCore helicsFederateGetCore(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    auto core = std::make_unique<helics::CoreObject>();
    core->valid = gCoreValidationIdentifier;
    core->coreptr = fedObj->getCorePointer();
    auto* retcore = reinterpret_cast<HelicsCore>(core.get());
    getMasterHolder()->addCore(std::move(core));
    return retcore;
}